

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall
CppGenerator::generateCode(CppGenerator *this,bool hasApplicationHandler,bool hasDynamicFunctions)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  size_t **ppsVar5;
  size_t *psVar6;
  size_t *psVar7;
  TDNode *pTVar8;
  View *pVVar9;
  long *plVar10;
  pointer pbVar11;
  bool bVar12;
  size_t var;
  long *plVar13;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  var_bitset nodeBag;
  string __str;
  long *local_78;
  ulong uStack_70;
  long local_68;
  long lStack_60;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  this->_hasApplicationHandler = hasApplicationHandler;
  this->_hasDynamicFunctions = hasDynamicFunctions;
  sVar3 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  sVar4 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  ppsVar5 = (size_t **)operator_new__(-(ulong)(sVar3 + sVar4 >> 0x3d != 0) | (sVar3 + sVar4) * 8);
  this->sortOrders = ppsVar5;
  sVar3 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar14 = sVar3 << 5;
  psVar6 = (size_t *)operator_new__(-(ulong)(sVar3 >> 0x3b != 0) | uVar14 | 8);
  *psVar6 = sVar3;
  if (sVar3 != 0) {
    psVar7 = psVar6 + 3;
    do {
      psVar7[-2] = (size_t)psVar7;
      psVar7[-1] = 0;
      *(undefined1 *)psVar7 = 0;
      psVar7 = psVar7 + 4;
      uVar14 = uVar14 - 0x20;
    } while (uVar14 != 0);
  }
  this->viewName = (string *)(psVar6 + 1);
  sVar3 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar14 = sVar3 * 8;
  if (0x1fffffffffffffff < sVar3) {
    uVar14 = 0xffffffffffffffff;
  }
  psVar6 = (size_t *)operator_new__(uVar14);
  this->viewLevelRegister = psVar6;
  sVar3 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (sVar3 != 0) {
    sVar3 = 0;
    do {
      pTVar8 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          sVar3);
      lVar17 = 0;
      uVar14 = 0;
      bVar1 = true;
      do {
        bVar12 = bVar1;
        uVar16 = (pTVar8->_bag).super__Base_bitset<2UL>._M_w[lVar17];
        uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
        uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
        uVar14 = uVar14 + (((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
        lVar17 = 1;
        bVar1 = false;
      } while (bVar12);
      uVar16 = uVar14 * 8;
      if (0x1fffffffffffffff < uVar14) {
        uVar16 = 0xffffffffffffffff;
      }
      psVar6 = (size_t *)operator_new__(uVar16);
      memset(psVar6,0,uVar16);
      this->sortOrders[sVar3] = psVar6;
      sVar3 = sVar3 + 1;
      sVar4 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (sVar3 < sVar4);
  }
  sVar3 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (sVar3 != 0) {
    uVar14 = 0;
    do {
      pVVar9 = QueryCompiler::getView
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,uVar14);
      lVar17 = 0;
      uVar16 = 0;
      bVar1 = true;
      do {
        bVar12 = bVar1;
        uVar18 = (pVVar9->_fVars).super__Base_bitset<2UL>._M_w[lVar17];
        uVar18 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
        uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
        uVar16 = uVar16 + (((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
        lVar17 = 1;
        bVar1 = false;
      } while (bVar12);
      uVar18 = uVar16 * 8;
      if (0x1fffffffffffffff < uVar16) {
        uVar18 = 0xffffffffffffffff;
      }
      psVar6 = (size_t *)operator_new__(uVar18);
      memset(psVar6,0,uVar18);
      ppsVar5 = this->sortOrders;
      sVar3 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ppsVar5[uVar14 + sVar3] = psVar6;
      cVar15 = '\x01';
      local_50 = local_40;
      if (9 < uVar14) {
        uVar16 = uVar14;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar16 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_001ef8a8;
          }
          if (uVar16 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_001ef8a8;
          }
          if (uVar16 < 10000) goto LAB_001ef8a8;
          bVar1 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar1);
        cVar15 = cVar15 + '\x01';
      }
LAB_001ef8a8:
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar14);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2a5219);
      plVar13 = plVar10 + 2;
      if ((long *)*plVar10 == plVar13) {
        local_68 = *plVar13;
        lStack_60 = plVar10[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar13;
        local_78 = (long *)*plVar10;
      }
      uStack_70 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)(this->viewName + uVar14),(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar14 = uVar14 + 1;
      sVar3 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    } while (uVar14 < sVar3);
  }
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (&this->variableDependency,100);
  sVar3 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (sVar3 != 0) {
    sVar3 = 0;
    do {
      pTVar8 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          sVar3);
      local_78 = (long *)(pTVar8->_bag).super__Base_bitset<2UL>._M_w[0];
      uStack_70 = (pTVar8->_bag).super__Base_bitset<2UL>._M_w[1];
      pbVar11 = (this->variableDependency).
                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      uVar14 = 0;
      do {
        if (((ulong)(&local_78)[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
          uVar16 = (pbVar11->super__Base_bitset<2UL>)._M_w[1];
          (pbVar11->super__Base_bitset<2UL>)._M_w[0] =
               (pbVar11->super__Base_bitset<2UL>)._M_w[0] | (ulong)local_78;
          (pbVar11->super__Base_bitset<2UL>)._M_w[1] = uVar16 | uStack_70;
        }
        uVar14 = uVar14 + 1;
        pbVar11 = pbVar11 + 1;
      } while (uVar14 != 100);
      sVar3 = sVar3 + 1;
      sVar4 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (sVar3 < sVar4);
  }
  ppsVar5 = this->sortOrders;
  pTVar8 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _root;
  uVar14 = 0;
  lVar17 = 0;
  do {
    if (((pTVar8->_bag).super__Base_bitset<2UL>._M_w[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
      ppsVar5[pTVar8->_id][lVar17] = uVar14;
      lVar17 = lVar17 + 1;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 100);
  createRelationSortingOrder(this,pTVar8,&pTVar8->_id);
  createGroupVariableOrder(this);
  computeParallelizeGroup(this,(multifaq::cppgen::PARALLEL_TYPE & 0xfffffffe) == 2);
  genDataHandler(this);
  if ((this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar3 = 0;
    do {
      genComputeGroupFiles(this,sVar3);
      sVar3 = sVar3 + 1;
    } while (sVar3 < (ulong)(((long)(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  genMainFunction(this,(multifaq::cppgen::PARALLEL_TYPE & 0xfffffffd) == 1);
  genMakeFile(this);
  return;
}

Assistant:

void CppGenerator::generateCode(bool hasApplicationHandler,
                                bool hasDynamicFunctions)
{
    DINFO("Start generate C++ code. \n");

    _hasApplicationHandler = hasApplicationHandler;
    _hasDynamicFunctions = hasDynamicFunctions;
    
    sortOrders = new size_t*[_td->numberOfRelations() + _qc->numberOfViews()];
    viewName = new std::string[_qc->numberOfViews()];
    viewLevelRegister  = new size_t[_qc->numberOfViews()];
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        sortOrders[rel] = new size_t[_td->getRelation(rel)->_bag.count()]();
    
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {   
        sortOrders[view + _td->numberOfRelations()] =
            new size_t[_qc->getView(view)->_fVars.count()]();
        viewName[view] = "V"+std::to_string(view);
    }
    
    variableDependency.resize(NUM_OF_VARIABLES);
    
    // Find all the dependencies amongst the variables
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        var_bitset nodeBag = _td->getRelation(rel)->_bag;

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (nodeBag[var])
                variableDependency[var] |= nodeBag;
        }
    }
    
    // FIRST WE CREATE THE VARIABLE ORDER FOR EACH RELATION
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_td->_root->_bag[var])
        {
            sortOrders[_td->_root->_id][orderIdx] = var;
            ++orderIdx;
        }
    }
    
    createRelationSortingOrder(_td->_root, _td->_root->_id);
    
    createGroupVariableOrder();

    bool domainParallelism = PARALLEL_TYPE == DOMAIN_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    computeParallelizeGroup(domainParallelism);
    
    genDataHandler();
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
        genComputeGroupFiles(group);
    
    bool taskParallelism = PARALLEL_TYPE == TASK_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    genMainFunction(taskParallelism);
    
    genMakeFile();    
}